

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O2

void helicsCoreSetLoggingCallback
               (HelicsCore core,_func_void_int_char_ptr_char_ptr_void_ptr *logger,void *userdata,
               HelicsError *err)

{
  Core *pCVar1;
  _Any_data *this;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this = &local_68;
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    if (logger == (_func_void_int_char_ptr_char_ptr_void_ptr *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      (*pCVar1->_vptr_Core[0x57])(pCVar1,0xfffffefd,&local_68);
    }
    else {
      local_28 = std::
                 _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:60:41)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/helicsCallbacks.cpp:60:41)>
                 ::_M_manager;
      local_40._M_unused._0_8_ = (undefined8)logger;
      local_40._8_8_ = userdata;
      (*pCVar1->_vptr_Core[0x57])(pCVar1,0xfffffefd,&local_40);
      this = &local_40;
    }
    std::_Function_base::~_Function_base((_Function_base *)this);
  }
  return;
}

Assistant:

void helicsCoreSetLoggingCallback(HelicsCore core,
                                  void (*logger)(int loglevel, const char* identifier, const char* message, void* userdata),
                                  void* userdata,
                                  HelicsError* err)
{
    auto* coreObj = getCore(core, err);
    if (coreObj == nullptr) {
        return;
    }
    try {
        if (logger == nullptr) {
            coreObj->setLoggingCallback(helics::gLocalCoreId, {});
        } else {
            coreObj->setLoggingCallback(helics::gLocalCoreId,
                                        [logger, userdata](int loglevel, std::string_view ident, std::string_view message) {
                                            const std::string identifier(ident);
                                            const std::string mess(message);
                                            logger(loglevel, identifier.c_str(), mess.c_str(), userdata);
                                        });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}